

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupSliced(Gia_Man_t *p,int nSuppMax)

{
  int iVar1;
  char *__s;
  Gia_Obj_t *pGVar2;
  int iVar3;
  uint uVar4;
  Gia_Man_t *p_00;
  size_t sVar5;
  char *__dest;
  Vec_Int_t *pVVar6;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  Gia_Obj_t *pGVar11;
  uint local_38;
  int local_34;
  
  p_00 = Gia_ManStart(5000);
  __s = p->pName;
  local_34 = nSuppMax;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar5 = strlen(__s);
    __dest = (char *)malloc(sVar5 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  p->pObjs->Value = 0;
  local_38 = 0;
  uVar4 = local_38;
  local_38 = 0;
  pVVar6 = p->vCis;
  if (0 < pVVar6->nSize) {
    do {
      if ((int)local_38 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = pVVar6->pArray[local_38];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001efd47;
      pGVar11 = p->pObjs;
      uVar4 = local_38;
      if (pGVar11 == (Gia_Obj_t *)0x0) break;
      pGVar7 = Gia_ManAppendObj(p_00);
      uVar8 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar8 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar8 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar2 = p_00->pObjs;
      if ((pGVar7 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar7)) {
LAB_001efd66:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555);
      pGVar2 = p_00->pObjs;
      if ((pGVar7 < pGVar2) || (pGVar2 + p_00->nObjs <= pGVar7)) goto LAB_001efd66;
      pGVar11[iVar1].Value = (int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * 0x55555556;
      local_38 = local_38 + 1;
      pVVar6 = p->vCis;
      uVar4 = local_38;
    } while ((int)local_38 < pVVar6->nSize);
  }
  local_38 = uVar4;
  Gia_ManCleanMark01(p);
  iVar1 = local_34;
  local_38 = 0;
  if (0 < p->nObjs) {
    uVar8 = 0;
    do {
      if ((int)uVar8 < 0) goto LAB_001efd47;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar11 = p->pObjs + uVar8;
      if ((~*(uint *)pGVar11 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar11) {
        iVar3 = Gia_ManSuppSize(p,(int *)&local_38,1);
        uVar8 = *(ulong *)pGVar11;
        uVar10 = (ulong)((uint)uVar8 & 0x1fffffff);
        if (iVar1 < iVar3) {
          *(ulong *)(pGVar11 + -uVar10) = *(ulong *)(pGVar11 + -uVar10) | 0x4000000000000000;
          pGVar11 = pGVar11 + -(ulong)(*(uint *)&pGVar11->field_0x4 & 0x1fffffff);
          uVar8 = 0x4000000000000000;
        }
        else {
          if ((int)pGVar11[-uVar10].Value < 0) {
LAB_001efda4:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          uVar4 = (uint)(uVar8 >> 0x20);
          if ((int)pGVar11[-(ulong)(uVar4 & 0x1fffffff)].Value < 0) goto LAB_001efda4;
          uVar4 = Gia_ManAppendAnd(p_00,(uint)(uVar8 >> 0x1d) & 1 ^ pGVar11[-uVar10].Value,
                                   pGVar11[-(ulong)(uVar4 & 0x1fffffff)].Value ^ uVar4 >> 0x1d & 1);
          pGVar11->Value = uVar4;
          uVar8 = 0x40000000;
        }
        *(ulong *)pGVar11 = *(ulong *)pGVar11 | uVar8;
      }
      local_38 = local_38 + 1;
      uVar8 = (ulong)local_38;
    } while ((int)local_38 < p->nObjs);
  }
  local_38 = 0;
  pVVar6 = p->vCos;
  if (0 < pVVar6->nSize) {
    lVar9 = 0;
    do {
      iVar1 = pVVar6->pArray[lVar9];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001efd47;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar11 = p->pObjs + iVar1;
      *(ulong *)(pGVar11 + -(ulong)((uint)*(undefined8 *)pGVar11 & 0x1fffffff)) =
           *(ulong *)(pGVar11 + -(ulong)((uint)*(undefined8 *)pGVar11 & 0x1fffffff)) |
           0x4000000000000000;
      lVar9 = lVar9 + 1;
      local_38 = (uint)lVar9;
      pVVar6 = p->vCos;
    } while (lVar9 < pVVar6->nSize);
  }
  local_38 = 0;
  if (0 < p->nObjs) {
    do {
      if ((int)local_38 < 0) {
LAB_001efd47:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar11 = p->pObjs + local_38;
      uVar8 = *(ulong *)pGVar11;
      if ((uVar8 & 0x40000000c0000000) == 0x4000000040000000 && (~(uint)uVar8 & 0x1fffffff) != 0) {
        Gia_ManAppendCo(p_00,pGVar11->Value);
      }
      local_38 = local_38 + 1;
    } while ((int)local_38 < p->nObjs);
  }
  Gia_ManCleanMark01(p);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupSliced( Gia_Man_t * p, int nSuppMax )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    // start the new manager
    pNew = Gia_ManStart( 5000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    // create constant and PIs
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // create internal nodes
    Gia_ManCleanMark01(p);
    Gia_ManForEachAnd( p, pObj, i )
        if ( Gia_ManSuppSize(p, &i, 1) <= nSuppMax )
        {
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
            pObj->fMark0 = 1;
        }
        else 
        {
            Gia_ObjFanin0(pObj)->fMark1 = 1;
            Gia_ObjFanin1(pObj)->fMark1 = 1;
        }
    Gia_ManForEachCo( p, pObj, i )
        Gia_ObjFanin0(pObj)->fMark1 = 1;
    // add POs for the nodes pointed to
    Gia_ManForEachAnd( p, pObj, i )
        if ( pObj->fMark0 && pObj->fMark1 )
            Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup and leave
    Gia_ManCleanMark01(p);
    return pNew;
}